

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O1

ivec4 ImageCodec::decodeSINT_SINTVec<short,2>(ImageCodec *param_1,void *ptr)

{
  undefined1 auVar1 [16];
  ivec4 iVar2;
  
  auVar1 = pshuflw(ZEXT416(*ptr),ZEXT416(*ptr),0x60);
  iVar2.field_0.field_0.y = auVar1._4_4_ >> 0x10;
  iVar2.field_0.field_0.x = auVar1._0_4_ >> 0x10;
  iVar2.field_0._8_8_ = 0;
  return (ivec4)iVar2.field_0;
}

Assistant:

static glm::ivec4 decodeSINT_SINTVec(const ImageCodec*, const void* ptr) {
        static_assert(std::is_signed_v<TYPE>);
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::ivec4 result(0, 0, 0, 0);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = data[i];
        return result;
    }